

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_network.cpp
# Opt level: O3

void __thiscall
NeuralNetwork::train
          (NeuralNetwork *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_xs,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *train_ys,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *test_xs,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   *test_ys)

{
  pointer pvVar1;
  double dVar2;
  ostream *poVar3;
  long lVar4;
  size_type sVar5;
  long lVar6;
  int iVar7;
  float fVar8;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  testXvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainYvecs;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  trainXvecs;
  double local_100;
  void *local_f8 [2];
  size_type local_e8;
  long local_e0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_d8;
  long local_d0;
  long local_c8;
  size_type local_b8;
  long local_b0;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_a8;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_88;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_68;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_50;
  vector<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  local_48;
  
  local_e0 = (long)(train_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(train_xs->
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
  local_d8 = train_ys;
  if (local_e0 !=
      (long)(train_ys->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(train_ys->
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("train_xs.size() == train_ys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                  ,0x5c,
                  "void NeuralNetwork::train(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
                 );
  }
  lVar4 = (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(test_xs->
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(test_ys->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("test_xs.size() == test_ys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Everglow123[P]NN/neural_network.cpp"
                  ,0x5d,
                  "void NeuralNetwork::train(std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &, std::vector<std::vector<float>> &)"
                 );
  }
  local_e8 = (local_e0 >> 3) * -0x5555555555555555;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50 = test_ys;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_48,local_e8);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_68,local_e8);
  sVar5 = (lVar4 >> 3) * -0x5555555555555555;
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_88,sVar5);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::reserve(&local_a8,sVar5);
  local_b8 = sVar5;
  local_b0 = lVar4;
  if (0 < local_e0) {
    sVar5 = 1;
    if (1 < (long)local_e8) {
      sVar5 = local_e8;
    }
    lVar4 = 8;
    do {
      pvVar1 = (train_xs->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_d0 = *(long *)((long)pvVar1 + lVar4 + -8);
      local_c8 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar4) - local_d0 >> 2;
      if (local_c8 < 0) goto LAB_00106161;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_f8,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_d0);
      std::vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>
      ::emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                  *)&local_48,(Matrix<float,__1,_1,_0,__1,_1> *)local_f8);
      free(local_f8[0]);
      lVar4 = lVar4 + 0x18;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    if (0 < local_e0) {
      sVar5 = 1;
      if (1 < (long)local_e8) {
        sVar5 = local_e8;
      }
      lVar4 = 8;
      do {
        pvVar1 = (local_d8->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_d0 = *(long *)((long)pvVar1 + lVar4 + -8);
        local_c8 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data + lVar4) - local_d0 >> 2;
        if (local_c8 < 0) goto LAB_00106161;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_f8,
                   (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_d0);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&local_68,(Matrix<float,__1,_1,_0,__1,_1> *)local_f8);
        free(local_f8[0]);
        lVar4 = lVar4 + 0x18;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
  }
  if (0 < local_b0) {
    sVar5 = 1;
    if (1 < (long)local_b8) {
      sVar5 = local_b8;
    }
    lVar4 = 8;
    do {
      pvVar1 = (test_xs->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_d0 = *(long *)((long)pvVar1 + lVar4 + -8);
      local_c8 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                  _M_impl.super__Vector_impl_data + lVar4) - local_d0 >> 2;
      if (local_c8 < 0) goto LAB_00106161;
      Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_f8,
                 (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_d0);
      std::vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>
      ::emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                  *)&local_88,(Matrix<float,__1,_1,_0,__1,_1> *)local_f8);
      free(local_f8[0]);
      lVar4 = lVar4 + 0x18;
      sVar5 = sVar5 - 1;
    } while (sVar5 != 0);
    if (0 < local_b0) {
      sVar5 = 1;
      if (1 < (long)local_b8) {
        sVar5 = local_b8;
      }
      lVar4 = 8;
      do {
        pvVar1 = (local_50->
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_d0 = *(long *)((long)pvVar1 + lVar4 + -8);
        local_c8 = *(long *)((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                    _M_impl.super__Vector_impl_data + lVar4) - local_d0 >> 2;
        if (local_c8 < 0) {
LAB_00106161:
          __assert_fail("vecSize >= 0","/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xa6,
                        "Eigen::MapBase<Eigen::Map<Eigen::Matrix<float, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, 1>>, Level = 0]"
                       );
        }
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::Map<Eigen::Matrix<float,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)local_f8,
                   (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&local_d0);
        std::
        vector<Eigen::Matrix<float,-1,1,0,-1,1>,std::allocator<Eigen::Matrix<float,-1,1,0,-1,1>>>::
        emplace_back<Eigen::Matrix<float,_1,1,0,_1,1>>
                  ((vector<Eigen::Matrix<float,_1,1,0,_1,1>,std::allocator<Eigen::Matrix<float,_1,1,0,_1,1>>>
                    *)&local_a8,(Matrix<float,__1,_1,_0,__1,_1> *)local_f8);
        free(local_f8[0]);
        lVar4 = lVar4 + 0x18;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
  }
  if (0 < this->epoch_) {
    local_d8 = (vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                *)(double)(long)local_e8;
    sVar5 = 1;
    if (1 < (long)local_e8) {
      sVar5 = local_e8;
    }
    iVar7 = 0;
    do {
      lVar4 = std::chrono::_V2::system_clock::now();
      if (local_e0 < 1) {
        local_100 = 0.0;
      }
      else {
        local_100 = 0.0;
        lVar6 = 0;
        do {
          forwardPropagation(this,(VectorXf *)
                                  ((long)&((local_48.
                                            super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                          ).m_storage.m_data + lVar6));
          backPropagation(this,(VectorXf *)
                               ((long)&((local_68.
                                         super__Vector_base<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
                                       ).m_storage.m_data + lVar6));
          gradientDescent(this);
          gradientClean(this);
          dVar2 = getLoss(this);
          local_100 = local_100 + dVar2;
          lVar6 = lVar6 + 0x10;
        } while (sVar5 * 0x10 != lVar6);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,anon_var_dwarf_59e7f,3);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_59e98,0x15);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
      lVar6 = std::chrono::_V2::system_clock::now();
      poVar3 = std::ostream::_M_insert<double>((double)(lVar6 - lVar4) / 1000000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,anon_var_dwarf_59eb1,0x10);
      std::ostream::flush();
      *(uint *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::random_device::_M_getval + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
      fVar8 = getAccuracy(this,&local_88,&local_a8);
      poVar3 = std::ostream::_M_insert<double>((double)(fVar8 * 100.0));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%,loss: ",8);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xfffffefb | 4;
      poVar3 = std::ostream::_M_insert<double>(local_100 / (double)local_d8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      iVar7 = iVar7 + 1;
    } while (iVar7 < this->epoch_);
  }
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_a8);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_88);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_68);
  std::
  vector<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void NeuralNetwork::train(std::vector<std::vector<float>>& train_xs,
                          std::vector<std::vector<float>>& train_ys,
                          std::vector<std::vector<float>>& test_xs,
                          std::vector<std::vector<float>>& test_ys) {
    using namespace std;
    using namespace chrono;
    using namespace Eigen;
    assert(train_xs.size() == train_ys.size());
    assert(test_xs.size() == test_ys.size());
    ssize_t trainingDataSize = train_xs.size();
    ssize_t testDataSize = test_xs.size();
    vector<VectorXf> trainXvecs, trainYvecs, testXvecs, testYvecs;
    trainXvecs.reserve(trainingDataSize);
    trainYvecs.reserve(trainingDataSize);
    testXvecs.reserve(testDataSize);
    testYvecs.reserve(testDataSize);
    for (int i = 0; i < trainingDataSize; ++i) {
        trainXvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_xs[i]));
        // xvecs.push_back(VectorXf(xs[i].data(),inputSize_));
    }
    for (int i = 0; i < trainingDataSize; ++i) {
        trainYvecs.push_back(NeuralNetwork::stdVecToEigenVec(train_ys[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testXvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_xs[i]));
    }
    for (int i = 0; i < testDataSize; ++i) {
        testYvecs.push_back(NeuralNetwork::stdVecToEigenVec(test_ys[i]));
    }
    for (int e = 0; e < epoch_; ++e) {
        int i = 0;
        double trainingLoss = 0;
        auto t = system_clock::now();
        while (i < trainingDataSize) {
            this->forwardPropagation(trainXvecs[i]);
            this->backPropagation(trainYvecs[i]);
            this->gradientDescent();
            this->gradientClean();
            trainingLoss += this->getLoss();
            ++i;
        }
        // cout<<this->layers_[layerCount_-2].weights<<endl;
        // abort();
        cout << "第" << e << "轮已完成,耗时: " << fixed
             << duration<double>(system_clock::now() - t).count() << "秒,准确率：";
        cout.flush();
        cout << fixed << this->getAccuracy(testXvecs, testYvecs) * 100 << R"(%,loss: )" << fixed
             << trainingLoss / trainingDataSize << endl;
    }
}